

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O2

int VP8IteratorRotateI4(VP8EncIterator *it,uint8_t *yuv_out)

{
  ushort uVar1;
  int iVar2;
  uint8_t *puVar3;
  int iVar4;
  uint8_t *puVar5;
  long lVar6;
  
  uVar1 = VP8Scan[it->i4];
  puVar3 = it->i4_top;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    puVar3[lVar6 + -4] = yuv_out[lVar6 + (ulong)uVar1 + 0x60];
  }
  if ((~it->i4 & 3U) == 0) {
    for (lVar6 = -4; lVar6 != 0; lVar6 = lVar6 + 1) {
      puVar3[lVar6 + 4] = puVar3[lVar6 + 8];
    }
  }
  else {
    puVar5 = yuv_out + (ulong)uVar1 + 0x43;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      puVar3[lVar6] = *puVar5;
      puVar5 = puVar5 + -0x20;
    }
  }
  iVar2 = it->i4;
  iVar4 = iVar2 + 1;
  it->i4 = iVar4;
  if (iVar4 != 0x10) {
    it->i4_top = it->i4_boundary +
                 "\x11\x15\x19\x1d\r\x11\x15\x19\t\r\x11\x15\x05\t\r\x11"[(long)iVar2 + 1];
  }
  return (uint)(iVar4 != 0x10);
}

Assistant:

int VP8IteratorRotateI4(VP8EncIterator* const it,
                        const uint8_t* const yuv_out) {
  const uint8_t* const blk = yuv_out + VP8Scan[it->i4];
  uint8_t* const top = it->i4_top;
  int i;

  // Update the cache with 7 fresh samples
  for (i = 0; i <= 3; ++i) {
    top[-4 + i] = blk[i + 3 * BPS];   // store future top samples
  }
  if ((it->i4 & 3) != 3) {  // if not on the right sub-blocks #3, #7, #11, #15
    for (i = 0; i <= 2; ++i) {        // store future left samples
      top[i] = blk[3 + (2 - i) * BPS];
    }
  } else {  // else replicate top-right samples, as says the specs.
    for (i = 0; i <= 3; ++i) {
      top[i] = top[i + 4];
    }
  }
  // move pointers to next sub-block
  ++it->i4;
  if (it->i4 == 16) {    // we're done
    return 0;
  }

  it->i4_top = it->i4_boundary + VP8TopLeftI4[it->i4];
  return 1;
}